

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

async_ctx * async_ctx_new(void)

{
  int iVar1;
  async_ctx *func;
  char *unaff_retaddr;
  async_ctx *nctx;
  CRYPTO_THREAD_LOCAL *in_stack_ffffffffffffffe8;
  OSSL_thread_stop_handler_fn in_stack_fffffffffffffff8;
  int line;
  
  iVar1 = ossl_init_thread_start(nctx,unaff_retaddr,in_stack_fffffffffffffff8);
  line = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  if (iVar1 != 0) {
    func = (async_ctx *)CRYPTO_malloc(0x4a8,"crypto/async/async.c",0x2a);
    if (func == (async_ctx *)0x0) {
      ERR_new();
      ERR_set_debug(unaff_retaddr,line,(char *)func);
      ERR_set_error(0x33,0xc0100,(char *)0x0);
    }
    else {
      func->currjob = (ASYNC_JOB *)0x0;
      func->blocked = 0;
      iVar1 = CRYPTO_THREAD_set_local(in_stack_ffffffffffffffe8,(void *)0x386cb1);
      if (iVar1 != 0) {
        return func;
      }
    }
    CRYPTO_free(func);
  }
  return (async_ctx *)0x0;
}

Assistant:

static async_ctx *async_ctx_new(void)
{
    async_ctx *nctx;

    if (!ossl_init_thread_start(NULL, NULL, async_delete_thread_state))
        return NULL;

    nctx = OPENSSL_malloc(sizeof(*nctx));
    if (nctx == NULL) {
        ERR_raise(ERR_LIB_ASYNC, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    async_fibre_init_dispatcher(&nctx->dispatcher);
    nctx->currjob = NULL;
    nctx->blocked = 0;
    if (!CRYPTO_THREAD_set_local(&ctxkey, nctx))
        goto err;

    return nctx;
err:
    OPENSSL_free(nctx);

    return NULL;
}